

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_start_str_notrack(mpack_writer_t *writer,uint32_t count)

{
  char *pcVar1;
  _Bool _Var2;
  uint8_t *u;
  long lVar3;
  ulong uVar4;
  
  if (count < 0x20) {
    if ((writer->end == writer->current) && (_Var2 = mpack_writer_ensure(writer,1), !_Var2)) {
      return;
    }
    *writer->current = (byte)count | 0xa0;
    lVar3 = 1;
  }
  else if ((count < 0x100) && (mpack_version_v4 < writer->version)) {
    if (((ulong)((long)writer->end - (long)writer->current) < 2) &&
       (_Var2 = mpack_writer_ensure(writer,2), !_Var2)) {
      return;
    }
    pcVar1 = writer->current;
    *pcVar1 = -0x27;
    pcVar1[1] = (byte)count;
    lVar3 = 2;
  }
  else {
    uVar4 = (long)writer->end - (long)writer->current;
    if (count < 0x10000) {
      if ((uVar4 < 3) && (_Var2 = mpack_writer_ensure(writer,3), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x26;
      *(ushort *)(pcVar1 + 1) = (ushort)count << 8 | (ushort)count >> 8;
      lVar3 = 3;
    }
    else {
      if ((uVar4 < 5) && (_Var2 = mpack_writer_ensure(writer,5), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x25;
      *(uint32_t *)(pcVar1 + 1) =
           count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
      lVar3 = 5;
    }
  }
  writer->current = writer->current + lVar3;
  return;
}

Assistant:

static void mpack_start_str_notrack(mpack_writer_t* writer, uint32_t count) {
    if (count <= 31) {
        MPACK_WRITE_ENCODED(mpack_encode_fixstr, MPACK_TAG_SIZE_FIXSTR, (uint8_t)count);

    // str8 is only supported in v5 or later.
    } else if (count <= UINT8_MAX
            #if MPACK_COMPATIBILITY
            && writer->version >= mpack_version_v5
            #endif
            ) {
        MPACK_WRITE_ENCODED(mpack_encode_str8, MPACK_TAG_SIZE_STR8, (uint8_t)count);

    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_str16, MPACK_TAG_SIZE_STR16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_str32, MPACK_TAG_SIZE_STR32, (uint32_t)count);
    }
}